

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 auStack_30 [4];
  int result;
  aiLogStream logstream;
  time_t t;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  testing::InitGoogleTest((int *)&argv_local,argv);
  time((time_t *)&logstream.user);
  srand((uint)logstream.user);
  Assimp::DefaultLogger::create("AssimpLog_Cpp.txt",VERBOSE,9,(IOSystem *)0x0);
  aiEnableVerboseLogging(1);
  _auStack_30 = aiGetPredefinedLogStream(aiDefaultLogStream_FILE,"AssimpLog_C.txt");
  aiAttachLogStream((aiLogStream *)auStack_30);
  iVar1 = RUN_ALL_TESTS();
  aiDetachAllLogStreams();
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    ::testing::InitGoogleTest(&argc, argv);

    // seed the randomizer with the current system time
    time_t t;time(&t);
    srand((unsigned int)t);

    // ............................................................................

    // create a logger from both CPP
    Assimp::DefaultLogger::create("AssimpLog_Cpp.txt",Assimp::Logger::VERBOSE,
        aiDefaultLogStream_DEBUGGER | aiDefaultLogStream_FILE);

    // .. and C. They should smoothly work together
    aiEnableVerboseLogging(AI_TRUE);
    aiLogStream logstream= aiGetPredefinedLogStream(aiDefaultLogStream_FILE, "AssimpLog_C.txt");
    aiAttachLogStream(&logstream);

    int result = RUN_ALL_TESTS();

    // ............................................................................
    // but shutdown must be done from C to ensure proper deallocation
    aiDetachAllLogStreams();

    return result;
}